

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsSetHostPromiseRejectionTracker
          (JsHostPromiseRejectionTrackerCallback promiseRejectionTrackerCallback,void *callbackState
          )

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  JsErrorCode JVar3;
  JsrtContext *currentContext;
  Type *addr;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar3 = CheckContext(currentContext,false,true);
  if (JVar3 == JsNoError) {
    pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
             ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary;
    (pJVar2->super_JavascriptLibraryBase).nativeHostPromiseRejectionTracker =
         (Type)promiseRejectionTrackerCallback;
    addr = &(pJVar2->super_JavascriptLibraryBase).nativeHostPromiseRejectionTrackerState;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = callbackState;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    JVar3 = JsNoError;
  }
  return JVar3;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetHostPromiseRejectionTracker(_In_ JsHostPromiseRejectionTrackerCallback promiseRejectionTrackerCallback, _In_opt_ void *callbackState)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        scriptContext->GetLibrary()->SetNativeHostPromiseRejectionTrackerCallback((Js::JavascriptLibrary::HostPromiseRejectionTrackerCallback) promiseRejectionTrackerCallback, callbackState);
        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}